

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

void __thiscall despot::BaseRockSample::CreateBeliefUpperBound(BaseRockSample *this)

{
  string *in_RSI;
  
  CreateBeliefUpperBound
            ((BaseRockSample *)
             &this[-1].transition_probabilities_.
              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI);
  return;
}

Assistant:

BeliefUpperBound* BaseRockSample::CreateBeliefUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefUpperBound(this);
	} else if (name == "DEFAULT" || name == "MDP") {
		return new RockSampleMDPBeliefUpperBound(this);
	} else {
		cerr << "Unsupported belief lower bound: " << name << endl;
		exit(1);
		return NULL;
	}
}